

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceObjectArchive::Serialize(DeviceObjectArchive *this,IDataBlob **ppDataBlob)

{
  Serializer<(Diligent::SerializerMode)1> *pSVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  pointer pSVar4;
  pointer pSVar5;
  undefined8 uVar6;
  IDataBlob **ppIVar7;
  bool bVar8;
  TEnableStr<const_char_*> TVar9;
  TEnableStr<const_char_*> TVar10;
  size_t sVar11;
  void *pvVar12;
  char (*Args_1) [17];
  _Hash_node_base *p_Var13;
  array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
  *paVar14;
  long lVar15;
  string msg;
  ResourceType ResType_1;
  RefCntAutoPtr<Diligent::DataBlobImpl> pDataBlob;
  Serializer<(Diligent::SerializerMode)1> Writer;
  ArchiveHeader Header;
  Serializer<(Diligent::SerializerMode)2> Measurer;
  Uint32 NumResources_1;
  undefined1 local_c8 [32];
  DeviceObjectArchive *local_a8;
  ResourceType local_9c;
  undefined1 local_98 [16];
  RefCountersImpl *local_88;
  RefCountersImpl *local_80;
  undefined8 local_78;
  uint uStack_70;
  Uint32 UStack_6c;
  char *local_68;
  IDataBlob **local_60;
  array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
  *local_58;
  Serializer<(Diligent::SerializerMode)2> local_50;
  uint local_34;
  
  local_a8 = this;
  if (ppDataBlob == (IDataBlob **)0x0) {
    FormatString<char[49]>
              ((string *)local_c8,(char (*) [49])"Pointer to the data blob object must not be null")
    ;
    DebugAssertionFailed
              ((Char *)local_c8._0_8_,"Serialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0xf3);
    if ((undefined1 *)local_c8._0_8_ == local_c8 + 0x10) {
      return;
    }
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    return;
  }
  if (*ppDataBlob != (IDataBlob *)0x0) {
    FormatString<char[30]>((string *)local_c8,(char (*) [30])"Data blob object must be null");
    DebugAssertionFailed
              ((Char *)local_c8._0_8_,"Serialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0xf6);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
  }
  local_50.m_Start = (TPointer)0x0;
  local_50.m_End = (TPointer)0xffffffff;
  local_50.m_Ptr = (TPointer)0x0;
  local_78 = (Char *)0x8de00000a;
  local_68 = "9c77d7ae";
  UStack_6c = local_a8->m_ContentVersion;
  uStack_70 = 0x3e808;
  bVar8 = Serializer<(Diligent::SerializerMode)2>::Copy<unsigned_int_const>
                    (&local_50,(uint *)&local_78,4);
  if ((!bVar8) ||
     (bVar8 = Serializer<(Diligent::SerializerMode)2>::operator()
                        (&local_50,(uint *)((long)&local_78 + 4),&uStack_70,&UStack_6c,&local_68),
     !bVar8)) {
    FormatString<char[27]>((string *)local_c8,(char (*) [27])"Failed to serialize header");
    DebugAssertionFailed
              ((Char *)local_c8._0_8_,"operator()",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x100);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
  }
  local_c8._0_8_ = (local_a8->m_NamedResources)._M_h._M_element_count;
  local_98._0_4_ = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)local_c8);
  bVar8 = Serializer<(Diligent::SerializerMode)2>::Copy<unsigned_int_const>
                    (&local_50,(uint *)local_98,4);
  if (!bVar8) {
    FormatString<char[44]>
              ((string *)local_c8,(char (*) [44])"Failed to serialize the number of resources");
    DebugAssertionFailed
              ((Char *)local_c8._0_8_,"operator()",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x104);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
  }
  p_Var13 = (local_a8->m_NamedResources)._M_h._M_before_begin._M_nxt;
  local_60 = ppDataBlob;
  if (p_Var13 != (_Hash_node_base *)0x0) {
    do {
      p_Var2 = p_Var13[2]._M_nxt;
      local_98._8_4_ = *(undefined4 *)&p_Var13[1]._M_nxt;
      bVar8 = Serializer<(Diligent::SerializerMode)2>::
              Copy<Diligent::DeviceObjectArchive::ResourceType_const>
                        (&local_50,(ResourceType *)(local_98 + 8),4);
      if ((!bVar8) ||
         (TVar9 = Serializer<(Diligent::SerializerMode)2>::Serialize<char_const*>
                            (&local_50,(CharPtr)p_Var2), !TVar9)) {
        FormatString<char[43]>
                  ((string *)local_c8,(char (*) [43])"Failed to serialize resource type and name");
        DebugAssertionFailed
                  ((Char *)local_c8._0_8_,"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                   ,0x10c);
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
      }
      p_Var2 = p_Var13[5]._M_nxt;
      p_Var3 = p_Var13[6]._M_nxt;
      local_c8._0_4_ = (int)p_Var3;
      bVar8 = Serializer<(Diligent::SerializerMode)2>::Copy<unsigned_int_const>
                        (&local_50,(uint *)local_c8,4);
      if (bVar8) {
        Serializer<(Diligent::SerializerMode)2>::AlignOffset(&local_50,8);
        bVar8 = Serializer<(Diligent::SerializerMode)2>::Copy<void_const>
                          (&local_50,p_Var2,(size_t)p_Var3);
        if (bVar8) {
          lVar15 = 0;
          do {
            if (lVar15 == 0xe0) goto LAB_006a9add;
            pvVar12 = *(void **)((long)&p_Var13[9]._M_nxt + lVar15);
            sVar11 = *(size_t *)((long)&p_Var13[10]._M_nxt + lVar15);
            local_c8._0_4_ = (int)sVar11;
            bVar8 = Serializer<(Diligent::SerializerMode)2>::Copy<unsigned_int_const>
                              (&local_50,(uint *)local_c8,4);
            if (!bVar8) break;
            Serializer<(Diligent::SerializerMode)2>::AlignOffset(&local_50,8);
            bVar8 = Serializer<(Diligent::SerializerMode)2>::Copy<void_const>
                              (&local_50,pvVar12,sVar11);
            lVar15 = lVar15 + 0x20;
          } while (bVar8);
          FormatString<char[34]>
                    ((string *)local_c8,(char (*) [34])"Failed to serialize resource data");
          DebugAssertionFailed
                    ((Char *)local_c8._0_8_,"operator()",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                     ,0x10f);
          if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
            operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
          }
        }
      }
LAB_006a9add:
      p_Var13 = p_Var13->_M_nxt;
    } while (p_Var13 != (_Hash_node_base *)0x0);
  }
  paVar14 = &local_a8->m_DeviceShaders;
  lVar15 = 0x38;
  local_58 = paVar14;
  do {
    local_98._8_4_ =
         (int)((ulong)((long)paVar14->_M_elems[0].
                             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)paVar14->_M_elems[0].
                            super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 5);
    bVar8 = Serializer<(Diligent::SerializerMode)2>::Copy<unsigned_int_const>
                      (&local_50,(uint *)(local_98 + 8),4);
    if (bVar8) {
      pSVar4 = paVar14->_M_elems[0].
               super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar5 = paVar14->_M_elems[0].
               super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar8 = pSVar4 == pSVar5;
      if (!bVar8) {
        pvVar12 = pSVar4->m_Ptr;
        sVar11 = pSVar4->m_Size;
        local_c8._0_4_ = (int)sVar11;
        bVar8 = Serializer<(Diligent::SerializerMode)2>::Copy<unsigned_int_const>
                          (&local_50,(uint *)local_c8,4);
        if (bVar8) {
          do {
            Serializer<(Diligent::SerializerMode)2>::AlignOffset(&local_50,8);
            bVar8 = Serializer<(Diligent::SerializerMode)2>::Copy<void_const>
                              (&local_50,pvVar12,sVar11);
            if (!bVar8) break;
            bVar8 = pSVar4 + 1 == pSVar5;
            if (bVar8) goto LAB_006a9bb8;
            pvVar12 = pSVar4[1].m_Ptr;
            sVar11 = pSVar4[1].m_Size;
            local_c8._0_4_ = (int)sVar11;
            bVar8 = Serializer<(Diligent::SerializerMode)2>::Copy<unsigned_int_const>
                              (&local_50,(uint *)local_c8,4);
            pSVar4 = pSVar4 + 1;
          } while (bVar8);
        }
        goto LAB_006a9bc1;
      }
LAB_006a9bb8:
      if (!bVar8) goto LAB_006a9bc1;
    }
    else {
LAB_006a9bc1:
      FormatString<char[28]>((string *)local_c8,(char (*) [28])"Failed to serialize shaders");
      DebugAssertionFailed
                ((Char *)local_c8._0_8_,"operator()",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                 ,0x115);
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
    }
    paVar14 = (array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
               *)((long)(local_a8->m_DeviceShaders)._M_elems + lVar15 + -0x20);
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0xe0);
  sVar11 = Serializer<(Diligent::SerializerMode)2>::GetSize(&local_50);
  DataBlobImpl::Create((DataBlobImpl *)local_98,sVar11,(void *)0x0);
  pvVar12 = DataBlobImpl::GetDataPtr((DataBlobImpl *)local_98._0_8_,0);
  sVar11 = DataBlobImpl::GetSize((DataBlobImpl *)local_98._0_8_);
  SerializedData::SerializedData((SerializedData *)local_c8,pvVar12,sVar11);
  local_98._8_8_ = local_c8._8_8_;
  local_88 = (RefCountersImpl *)((long)(local_c8._8_8_ + 8) + (local_c8._16_8_ - 8));
  local_80 = (RefCountersImpl *)local_c8._8_8_;
  SerializedData::~SerializedData((SerializedData *)local_c8);
  local_78 = (Char *)0x8de00000a;
  local_68 = "9c77d7ae";
  UStack_6c = local_a8->m_ContentVersion;
  uStack_70 = 0x3e808;
  bVar8 = Serializer<(Diligent::SerializerMode)1>::Copy<unsigned_int_const>
                    ((Serializer<(Diligent::SerializerMode)1> *)(local_98 + 8),(uint *)&local_78,4);
  if (bVar8) {
    Args_1 = (char (*) [17])&UStack_6c;
    bVar8 = Serializer<(Diligent::SerializerMode)1>::operator()
                      ((Serializer<(Diligent::SerializerMode)1> *)(local_98 + 8),
                       (uint *)((long)&local_78 + 4),&uStack_70,(uint *)Args_1,&local_68);
    if (bVar8) goto LAB_006a9d2d;
  }
  FormatString<char[27]>((string *)local_c8,(char (*) [27])"Failed to serialize header");
  Args_1 = (char (*) [17])0x100;
  DebugAssertionFailed
            ((Char *)local_c8._0_8_,"operator()",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
             ,0x100);
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
LAB_006a9d2d:
  local_c8._0_8_ = (local_a8->m_NamedResources)._M_h._M_element_count;
  local_34 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)local_c8);
  bVar8 = Serializer<(Diligent::SerializerMode)1>::Copy<unsigned_int_const>
                    ((Serializer<(Diligent::SerializerMode)1> *)(local_98 + 8),&local_34,4);
  if (!bVar8) {
    FormatString<char[44]>
              ((string *)local_c8,(char (*) [44])"Failed to serialize the number of resources");
    Args_1 = (char (*) [17])0x104;
    DebugAssertionFailed
              ((Char *)local_c8._0_8_,"operator()",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x104);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
  }
  p_Var13 = (local_a8->m_NamedResources)._M_h._M_before_begin._M_nxt;
  if (p_Var13 != (_Hash_node_base *)0x0) {
    pSVar1 = (Serializer<(Diligent::SerializerMode)1> *)(local_98 + 8);
    do {
      p_Var2 = p_Var13[2]._M_nxt;
      local_9c = *(ResourceType *)&p_Var13[1]._M_nxt;
      bVar8 = Serializer<(Diligent::SerializerMode)1>::
              Copy<Diligent::DeviceObjectArchive::ResourceType_const>(pSVar1,&local_9c,4);
      if ((!bVar8) ||
         (TVar10 = Serializer<(Diligent::SerializerMode)1>::Serialize<char_const*>
                             (pSVar1,(CharPtr)p_Var2), !TVar10)) {
        FormatString<char[43]>
                  ((string *)local_c8,(char (*) [43])"Failed to serialize resource type and name");
        Args_1 = (char (*) [17])0x10c;
        DebugAssertionFailed
                  ((Char *)local_c8._0_8_,"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                   ,0x10c);
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
      }
      p_Var2 = p_Var13[5]._M_nxt;
      p_Var3 = p_Var13[6]._M_nxt;
      local_c8._0_4_ = (int)p_Var3;
      bVar8 = Serializer<(Diligent::SerializerMode)1>::Copy<unsigned_int_const>
                        (pSVar1,(uint *)local_c8,4);
      if (bVar8) {
        Serializer<(Diligent::SerializerMode)1>::AlignOffset(pSVar1,8);
        bVar8 = Serializer<(Diligent::SerializerMode)1>::Copy<void_const>
                          (pSVar1,p_Var2,(size_t)p_Var3);
        if (bVar8) {
          lVar15 = 0;
          do {
            if (lVar15 == 0xe0) goto LAB_006a9f19;
            pvVar12 = *(void **)((long)&p_Var13[9]._M_nxt + lVar15);
            sVar11 = *(size_t *)((long)&p_Var13[10]._M_nxt + lVar15);
            local_c8._0_4_ = (int)sVar11;
            bVar8 = Serializer<(Diligent::SerializerMode)1>::Copy<unsigned_int_const>
                              (pSVar1,(uint *)local_c8,4);
            if (!bVar8) break;
            Serializer<(Diligent::SerializerMode)1>::AlignOffset(pSVar1,8);
            bVar8 = Serializer<(Diligent::SerializerMode)1>::Copy<void_const>(pSVar1,pvVar12,sVar11)
            ;
            lVar15 = lVar15 + 0x20;
          } while (bVar8);
          FormatString<char[34]>
                    ((string *)local_c8,(char (*) [34])"Failed to serialize resource data");
          Args_1 = (char (*) [17])0x10f;
          DebugAssertionFailed
                    ((Char *)local_c8._0_8_,"operator()",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                     ,0x10f);
          if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
            operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
          }
        }
      }
LAB_006a9f19:
      p_Var13 = p_Var13->_M_nxt;
    } while (p_Var13 != (_Hash_node_base *)0x0);
  }
  lVar15 = 0x38;
  pSVar1 = (Serializer<(Diligent::SerializerMode)1> *)(local_98 + 8);
  paVar14 = local_58;
  do {
    local_9c = (ResourceType)
               ((ulong)((long)paVar14->_M_elems[0].
                              super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)paVar14->_M_elems[0].
                             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5);
    bVar8 = Serializer<(Diligent::SerializerMode)1>::Copy<unsigned_int_const>(pSVar1,&local_9c,4);
    if (bVar8) {
      pSVar4 = paVar14->_M_elems[0].
               super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar5 = paVar14->_M_elems[0].
               super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar8 = pSVar4 == pSVar5;
      if (!bVar8) {
        pvVar12 = pSVar4->m_Ptr;
        sVar11 = pSVar4->m_Size;
        local_c8._0_4_ = (int)sVar11;
        bVar8 = Serializer<(Diligent::SerializerMode)1>::Copy<unsigned_int_const>
                          (pSVar1,(uint *)local_c8,4);
        if (bVar8) {
          do {
            Serializer<(Diligent::SerializerMode)1>::AlignOffset(pSVar1,8);
            bVar8 = Serializer<(Diligent::SerializerMode)1>::Copy<void_const>(pSVar1,pvVar12,sVar11)
            ;
            if (!bVar8) break;
            bVar8 = pSVar4 + 1 == pSVar5;
            if (bVar8) goto LAB_006a9fe1;
            pvVar12 = pSVar4[1].m_Ptr;
            sVar11 = pSVar4[1].m_Size;
            local_c8._0_4_ = (int)sVar11;
            bVar8 = Serializer<(Diligent::SerializerMode)1>::Copy<unsigned_int_const>
                              (pSVar1,(uint *)local_c8,4);
            pSVar4 = pSVar4 + 1;
          } while (bVar8);
        }
        goto LAB_006a9fe5;
      }
LAB_006a9fe1:
      if (!bVar8) goto LAB_006a9fe5;
    }
    else {
LAB_006a9fe5:
      FormatString<char[28]>((string *)local_c8,(char (*) [28])"Failed to serialize shaders");
      Args_1 = (char (*) [17])0x115;
      DebugAssertionFailed
                ((Char *)local_c8._0_8_,"operator()",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                 ,0x115);
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
    }
    ppIVar7 = local_60;
    paVar14 = (array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
               *)((long)(local_a8->m_DeviceShaders)._M_elems + lVar15 + -0x20);
    lVar15 = lVar15 + 0x18;
    if (lVar15 == 0xe0) {
      if (local_80 != local_88) {
        FormatString<char[26],char[17]>
                  ((string *)local_c8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Writer.IsEnded()",Args_1);
        DebugAssertionFailed
                  ((Char *)local_c8._0_8_,"Serialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                   ,0x120);
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
      }
      uVar6 = local_98._0_8_;
      local_98._0_8_ = (_func_int **)0x0;
      *ppIVar7 = (IDataBlob *)uVar6;
      RefCntAutoPtr<Diligent::DataBlobImpl>::Release
                ((RefCntAutoPtr<Diligent::DataBlobImpl> *)local_98);
      return;
    }
  } while( true );
}

Assistant:

void DeviceObjectArchive::Serialize(IDataBlob** ppDataBlob) const
{
    if (ppDataBlob == nullptr)
    {
        DEV_ERROR("Pointer to the data blob object must not be null");
        return;
    }
    DEV_CHECK_ERR(*ppDataBlob == nullptr, "Data blob object must be null");

    auto SerializeThis = [this](auto& Ser) {
        constexpr auto SerMode    = std::remove_reference<decltype(Ser)>::type::GetMode();
        const auto     ArchiveSer = ArchiveSerializer<SerMode>{Ser};

        ArchiveHeader Header;
        Header.ContentVersion = m_ContentVersion;

        auto res = ArchiveSer.SerializeHeader(Header);
        VERIFY(res, "Failed to serialize header");

        Uint32 NumResources = StaticCast<Uint32>(m_NamedResources.size());
        res                 = Ser(NumResources);
        VERIFY(res, "Failed to serialize the number of resources");

        for (const auto& res_it : m_NamedResources)
        {
            const auto* Name    = res_it.first.GetName();
            const auto  ResType = res_it.first.GetType();

            res = Ser(ResType, Name);
            VERIFY(res, "Failed to serialize resource type and name");

            res = ArchiveSer.SerializeResourceData(res_it.second);
            VERIFY(res, "Failed to serialize resource data");
        }

        for (auto& Shaders : m_DeviceShaders)
        {
            res = ArchiveSer.SerializeShaders(Shaders);
            VERIFY(res, "Failed to serialize shaders");
        }
    };

    Serializer<SerializerMode::Measure> Measurer;
    SerializeThis(Measurer);

    auto pDataBlob = DataBlobImpl::Create(Measurer.GetSize());

    Serializer<SerializerMode::Write> Writer{SerializedData{pDataBlob->GetDataPtr(), pDataBlob->GetSize()}};
    SerializeThis(Writer);
    VERIFY_EXPR(Writer.IsEnded());

    *ppDataBlob = pDataBlob.Detach();
}